

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O3

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  cmScanDepInfo *this;
  bool bVar1;
  bool bVar2;
  UInt UVar3;
  ArrayIndex AVar4;
  LookupMethod LVar5;
  Value *pVVar6;
  Value *pVVar7;
  Value *pVVar8;
  bool bVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_16;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_18;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_20;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_21;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_22;
  const_iterator cVar12;
  string extra_output;
  string wd;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  Reader reader;
  Value ppio;
  ifstream ppf;
  undefined1 local_498 [56];
  undefined1 local_460 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  undefined8 local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  String *local_420;
  String local_418;
  char local_3f8;
  ValueIteratorBase local_3f0;
  undefined1 local_3e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined2 local_380;
  LookupMethod local_37c;
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [3];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d0;
  SelfType local_2b0;
  cmScanDepInfo *local_2a0;
  ValueIteratorBase local_298;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_288;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_280;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_278;
  Value local_270;
  SelfType local_248;
  istream local_238;
  
  Json::Value::Value(&local_270,nullValue);
  std::ifstream::ifstream(&local_238,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_3e0);
  bVar1 = Json::Reader::parse((Reader *)local_3e0,&local_238,&local_270,false);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_p != local_330) {
      operator_delete(local_340._M_p,local_330[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               &local_390);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3e0);
    pVVar6 = Json::Value::operator[](&local_270,"version");
    UVar3 = Json::Value::asUInt(pVVar6);
    if (UVar3 < 2) {
      pVVar6 = Json::Value::operator[](&local_270,"rules");
      bVar1 = Json::Value::isArray(pVVar6);
      bVar9 = true;
      if (!bVar1) goto LAB_00698697;
      AVar4 = Json::Value::size(pVVar6);
      if (AVar4 == 1) {
        cVar12 = Json::Value::begin(pVVar6);
        local_298.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
        local_298.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
        cVar12 = Json::Value::end(pVVar6);
        local_248.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
        local_280 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    &info->ExtraOutputs;
        local_278 = &info->Provides;
        local_288 = &info->Requires;
        local_2a0 = info;
        while (bVar1 = Json::ValueIteratorBase::isEqual(&local_298,&local_248), !bVar1) {
          pVVar6 = Json::ValueIteratorBase::deref(&local_298);
          local_3f8 = '\0';
          pVVar7 = Json::Value::operator[](pVVar6,"work-directory");
          bVar1 = Json::Value::isString(pVVar7);
          if (!bVar1) {
            bVar1 = Json::Value::isNull(pVVar7);
            if (bVar1) goto LAB_006988c1;
            cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33]>
                      ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                       arg_pp,(char (*) [33])": work-directory is not a string");
            cmSystemTools::Error((string *)local_3e0);
LAB_00699ceb:
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._16_8_;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e0._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3e0 + 0x10)) {
LAB_00699d08:
              operator_delete(paVar11,(ulong)((long)paVar10 + 1));
            }
LAB_00699d10:
            if ((local_3f8 != '\x01') ||
               (local_3f8 = '\0',
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_418._M_dataplus._M_p == &local_418.field_2)) goto LAB_00698695;
            goto LAB_00698577;
          }
          local_460._0_8_ = local_460 + 0x10;
          local_460._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
          bVar1 = ParseFilename(pVVar7,(string *)local_460);
          if (bVar1) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_418,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460);
          }
          else {
            local_3e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_3e0._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3c0._M_allocated_capacity = (size_type)(arg_pp->_M_dataplus)._M_p;
            local_3e0._24_8_ = arg_pp->_M_string_length;
            local_3c0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3b0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xe;
            local_3b0._8_8_ = ": invalid blob";
            local_3a0._M_allocated_capacity = 0;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_3e0;
            cmCatViews((string *)local_498,views_01);
            cmSystemTools::Error((string *)local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498 + 0x10)) {
              operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_460 + 0x10)) {
            operator_delete((void *)local_460._0_8_,(ulong)(local_460._16_8_ + 1));
          }
          if (!bVar1) goto LAB_00699d10;
LAB_006988c1:
          bVar1 = Json::Value::isMember(pVVar6,"primary-output");
          if (bVar1) {
            pVVar7 = Json::Value::operator[](pVVar6,"primary-output");
            bVar1 = ParseFilename(pVVar7,&local_2a0->PrimaryOutput);
            if (bVar1) {
              if (((local_3f8 == '\x01') &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_418._M_string_length !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) &&
                 (bVar1 = cmsys::SystemTools::FileIsFullPath(&local_2a0->PrimaryOutput),
                 this = local_2a0, !bVar1)) {
                local_3e0._0_8_ = local_418._M_string_length;
                local_3e0._8_8_ = local_418._M_dataplus._M_p;
                local_3e0._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_460._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_460._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1;
                local_460._16_8_ = local_460 + 0x18;
                local_460[0x18] = 0x2f;
                local_3e0._24_8_ = (_Elt_pointer)0x1;
                local_3c0._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_3b0._8_8_ = (local_2a0->PrimaryOutput)._M_dataplus._M_p;
                local_3b0._0_8_ = (local_2a0->PrimaryOutput)._M_string_length;
                local_3a0._M_allocated_capacity = 0;
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_3e0;
                local_3c0._M_allocated_capacity = local_460._16_8_;
                cmCatViews((string *)local_498,views_02);
                std::__cxx11::string::operator=((string *)this,(string *)local_498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_498 + 0x10)) {
                  operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
                }
              }
              goto LAB_006989f4;
            }
            local_3e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_3e0._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3c0._M_allocated_capacity = (size_type)(arg_pp->_M_dataplus)._M_p;
            local_3e0._24_8_ = arg_pp->_M_string_length;
            local_3c0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3b0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x12;
            local_3b0._8_8_ = ": invalid filename";
            local_3a0._M_allocated_capacity = 0;
            views_22._M_len = 3;
            views_22._M_array = (iterator)local_3e0;
            cmCatViews((string *)local_460,views_22);
            cmSystemTools::Error((string *)local_460);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_460._16_8_;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_460._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_460._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_460 + 0x10)) goto LAB_00699d10;
            goto LAB_00699d08;
          }
LAB_006989f4:
          bVar1 = Json::Value::isMember(pVVar6,"outputs");
          if (bVar1) {
            pVVar7 = Json::Value::operator[](pVVar6,"outputs");
            bVar1 = Json::Value::isArray(pVVar7);
            if (bVar1) {
              cVar12 = Json::Value::begin(pVVar7);
              local_3f0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
              local_3f0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
              cVar12 = Json::Value::end(pVVar7);
              local_2b0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
              local_2b0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
              while (bVar1 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2b0), !bVar1) {
                pVVar7 = Json::ValueIteratorBase::deref(&local_3f0);
                local_498._0_8_ = local_498 + 0x10;
                local_498._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_498._16_8_ = local_498._16_8_ & 0xffffffffffffff00;
                bVar1 = ParseFilename(pVVar7,(string *)local_498);
                if (bVar1) {
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_498), !bVar2)) {
                    local_3e0._0_8_ = local_418._M_string_length;
                    local_3e0._8_8_ = local_418._M_dataplus._M_p;
                    local_3e0._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_460._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_460._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    local_460._16_8_ = local_460 + 0x18;
                    local_460[0x18] = 0x2f;
                    local_3e0._24_8_ = (_Elt_pointer)0x1;
                    local_3c0._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_3b0._0_8_ = local_498._8_8_;
                    local_3b0._8_8_ = local_498._0_8_;
                    local_3a0._M_allocated_capacity = 0;
                    views_03._M_len = 3;
                    views_03._M_array = (iterator)local_3e0;
                    local_3c0._M_allocated_capacity = local_460._16_8_;
                    cmCatViews(&local_2d0,views_03);
                    std::__cxx11::string::operator=((string *)local_498,(string *)&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            (local_280,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_498);
                }
                else {
                  local_3e0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_3e0._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_3c0._M_allocated_capacity = (size_type)(arg_pp->_M_dataplus)._M_p;
                  local_3e0._24_8_ = arg_pp->_M_string_length;
                  local_3c0._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_3b0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x12;
                  local_3b0._8_8_ = ": invalid filename";
                  local_3a0._M_allocated_capacity = 0;
                  views_04._M_len = 3;
                  views_04._M_array = (iterator)local_3e0;
                  cmCatViews((string *)local_460,views_04);
                  cmSystemTools::Error((string *)local_460);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_460._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_460 + 0x10)) {
                    operator_delete((void *)local_460._0_8_,(ulong)(local_460._16_8_ + 1));
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_498 + 0x10)) {
                  operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
                }
                if (!bVar1) goto LAB_00699d10;
                Json::ValueIteratorBase::increment(&local_3f0);
              }
            }
          }
          bVar1 = Json::Value::isMember(pVVar6,"provides");
          if (bVar1) {
            pVVar7 = Json::Value::operator[](pVVar6,"provides");
            bVar1 = Json::Value::isArray(pVVar7);
            if (!bVar1) {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse "
                         ,arg_pp,(char (*) [27])": provides is not an array");
              cmSystemTools::Error((string *)local_3e0);
              goto LAB_00699ceb;
            }
            cVar12 = Json::Value::begin(pVVar7);
            local_3f0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
            local_3f0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
            cVar12 = Json::Value::end(pVVar7);
            local_2b0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
            local_2b0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
            while (bVar1 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2b0), !bVar1) {
              pVVar7 = Json::ValueIteratorBase::deref(&local_3f0);
              local_3e0._0_8_ = local_3e0 + 0x10;
              local_3e0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3e0._16_8_ = local_3e0._16_8_ & 0xffffffffffffff00;
              local_3c0._M_allocated_capacity = (size_type)local_3b0;
              local_3c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3b0._0_8_ = local_3b0._0_8_ & 0xffffffffffffff00;
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              local_3a0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_390._M_allocated_capacity = local_390._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_380._0_1_ = false;
              local_380._1_1_ = true;
              local_37c = ByName;
              pVVar8 = Json::Value::operator[](pVVar7,"logical-name");
              bVar1 = ParseFilename(pVVar8,(string *)local_3e0);
              if (!bVar1) {
                local_460._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_460._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(arg_pp->_M_dataplus)._M_p;
                local_460._24_8_ = arg_pp->_M_string_length;
                local_438 = 0;
                local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x96a319;
                local_420 = (String *)0x0;
                views_10._M_len = 3;
                views_10._M_array = (iterator)local_460;
                cmCatViews((string *)local_498,views_10);
                cmSystemTools::Error((string *)local_498);
                goto LAB_00699c86;
              }
              bVar1 = Json::Value::isMember(pVVar7,"compiled-module-path");
              if (bVar1) {
                pVVar8 = Json::Value::operator[](pVVar7,"compiled-module-path");
                bVar1 = ParseFilename(pVVar8,(string *)&local_3a0);
                if (!bVar1) {
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(arg_pp->_M_dataplus)._M_p;
                  local_460._24_8_ = arg_pp->_M_string_length;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x96a358;
                  local_420 = (String *)0x0;
                  views_12._M_len = 3;
                  views_12._M_array = (iterator)local_460;
                  cmCatViews((string *)local_498,views_12);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_00699c86;
                }
                if (((local_3f8 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_418._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) &&
                   (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&local_3a0), !bVar1)) {
                  local_460._0_8_ = local_418._M_string_length;
                  local_460._8_8_ = local_418._M_dataplus._M_p;
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._16_8_ = local_498 + 0x18;
                  local_498[0x18] = '/';
                  local_460._24_8_ = 1;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3a0._8_8_;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3a0._M_allocated_capacity;
                  local_420 = (String *)0x0;
                  views_05._M_len = 3;
                  views_05._M_array = (iterator)local_460;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_498._16_8_;
                  cmCatViews(&local_2d0,views_05);
                  std::__cxx11::string::operator=
                            ((string *)local_3a0._M_local_buf,(string *)&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              bVar1 = Json::Value::isMember(pVVar7,"unique-on-source-path");
              if (bVar1) {
                pVVar8 = Json::Value::operator[](pVVar7,"unique-on-source-path");
                bVar1 = Json::Value::isBool(pVVar8);
                if (!bVar1) {
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(arg_pp->_M_dataplus)._M_p;
                  local_460._24_8_ = arg_pp->_M_string_length;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x96a3cf;
                  local_420 = (String *)0x0;
                  views_13._M_len = 3;
                  views_13._M_array = (iterator)local_460;
                  cmCatViews((string *)local_498,views_13);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_00699c86;
                }
                bVar1 = Json::Value::asBool(pVVar8);
              }
              else {
                bVar1 = false;
              }
              local_380._0_1_ = bVar1;
              bVar1 = Json::Value::isMember(pVVar7,"source-path");
              if (bVar1) {
                pVVar8 = Json::Value::operator[](pVVar7,"source-path");
                bVar1 = ParseFilename(pVVar8,(string *)&local_3c0);
                if (!bVar1) {
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(arg_pp->_M_dataplus)._M_p;
                  local_460._24_8_ = arg_pp->_M_string_length;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x96a358;
                  local_420 = (String *)0x0;
                  views_15._M_len = 3;
                  views_15._M_array = (iterator)local_460;
                  cmCatViews((string *)local_498,views_15);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_00699c86;
                }
                if (((local_3f8 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_418._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) &&
                   (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&local_3c0), !bVar1)) {
                  local_460._0_8_ = local_418._M_string_length;
                  local_460._8_8_ = local_418._M_dataplus._M_p;
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._16_8_ = local_498 + 0x18;
                  local_498[0x18] = '/';
                  local_460._24_8_ = 1;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3c0._8_8_;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3c0._M_allocated_capacity;
                  local_420 = (String *)0x0;
                  views_06._M_len = 3;
                  views_06._M_array = (iterator)local_460;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_498._16_8_;
                  cmCatViews(&local_2d0,views_06);
                  std::__cxx11::string::operator=
                            ((string *)local_3c0._M_local_buf,(string *)&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              else if (local_380._0_1_ == true) {
                local_460._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_460._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(arg_pp->_M_dataplus)._M_p;
                local_460._24_8_ = arg_pp->_M_string_length;
                local_438 = 0;
                local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x96a3f8;
                local_420 = (String *)0x0;
                views_14._M_len = 3;
                views_14._M_array = (iterator)local_460;
                cmCatViews((string *)local_498,views_14);
                cmSystemTools::Error((string *)local_498);
                goto LAB_00699c86;
              }
              bVar1 = Json::Value::isMember(pVVar7,"is-interface");
              bVar2 = true;
              if (bVar1) {
                pVVar7 = Json::Value::operator[](pVVar7,"is-interface");
                bVar1 = Json::Value::isBool(pVVar7);
                if (!bVar1) {
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(arg_pp->_M_dataplus)._M_p;
                  local_460._24_8_ = arg_pp->_M_string_length;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x96a41e;
                  local_420 = (String *)0x0;
                  views_16._M_len = 3;
                  views_16._M_array = (iterator)local_460;
                  cmCatViews((string *)local_498,views_16);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_00699c86;
                }
                bVar2 = Json::Value::asBool(pVVar7);
              }
              local_380._1_1_ = bVar2;
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_278,(value_type *)local_3e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_allocated_capacity != &local_390) {
                operator_delete((void *)local_3a0._M_allocated_capacity,
                                (ulong)(local_390._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0) {
                operator_delete((void *)local_3c0._M_allocated_capacity,(ulong)(local_3b0._0_8_ + 1)
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e0._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3e0 + 0x10)) {
                operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
              }
              Json::ValueIteratorBase::increment(&local_3f0);
            }
          }
          bVar1 = Json::Value::isMember(pVVar6,"requires");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar6,"requires");
            bVar1 = Json::Value::isArray(pVVar6);
            if (bVar1) {
              cVar12 = Json::Value::begin(pVVar6);
              local_3f0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
              local_3f0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
              cVar12 = Json::Value::end(pVVar6);
              local_2b0.current_ = cVar12.super_ValueIteratorBase.current_._M_node;
              local_2b0.isNull_ = cVar12.super_ValueIteratorBase.isNull_;
LAB_006991ca:
              bVar1 = Json::ValueIteratorBase::isEqual(&local_3f0,&local_2b0);
              if (bVar1) goto LAB_006996d1;
              pVVar6 = Json::ValueIteratorBase::deref(&local_3f0);
              local_3e0._0_8_ = local_3e0 + 0x10;
              local_3e0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3e0._16_8_ = local_3e0._16_8_ & 0xffffffffffffff00;
              local_3c0._M_allocated_capacity = (size_type)local_3b0;
              local_3c0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3b0._0_8_ = local_3b0._0_8_ & 0xffffffffffffff00;
              local_3a0._M_allocated_capacity = (size_type)&local_390;
              local_3a0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_390._M_allocated_capacity = local_390._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_380._0_1_ = false;
              local_380._1_1_ = true;
              local_37c = ByName;
              pVVar7 = Json::Value::operator[](pVVar6,"logical-name");
              bVar1 = ParseFilename(pVVar7,(string *)local_3e0);
              if (!bVar1) {
                local_460._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_460._16_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(arg_pp->_M_dataplus)._M_p;
                local_460._24_8_ = arg_pp->_M_string_length;
                local_438 = 0;
                local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x96a319;
                local_420 = (String *)0x0;
                views_11._M_len = 3;
                views_11._M_array = (iterator)local_460;
                cmCatViews((string *)local_498,views_11);
                cmSystemTools::Error((string *)local_498);
                goto LAB_00699c86;
              }
              bVar1 = Json::Value::isMember(pVVar6,"compiled-module-path");
              if (!bVar1) {
LAB_006993b7:
                bVar1 = Json::Value::isMember(pVVar6,"unique-on-source-path");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"unique-on-source-path");
                  bVar1 = Json::Value::isBool(pVVar7);
                  if (!bVar1) {
                    local_460._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x26;
                    local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                    local_460._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(arg_pp->_M_dataplus)._M_p;
                    local_460._24_8_ = arg_pp->_M_string_length;
                    local_438 = 0;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&DAT_00000028;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x96a3cf;
                    local_420 = (String *)0x0;
                    views_18._M_len = 3;
                    views_18._M_array = (iterator)local_460;
                    cmCatViews((string *)local_498,views_18);
                    cmSystemTools::Error((string *)local_498);
                    goto LAB_00699c86;
                  }
                  bVar1 = Json::Value::asBool(pVVar7);
                }
                else {
                  bVar1 = false;
                }
                local_380._0_1_ = bVar1;
                bVar1 = Json::Value::isMember(pVVar6,"source-path");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"source-path");
                  bVar1 = ParseFilename(pVVar7,(string *)&local_3c0);
                  if (!bVar1) {
                    local_460._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x26;
                    local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                    local_460._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(arg_pp->_M_dataplus)._M_p;
                    local_460._24_8_ = arg_pp->_M_string_length;
                    local_438 = 0;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x12;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x96a358;
                    local_420 = (String *)0x0;
                    views_20._M_len = 3;
                    views_20._M_array = (iterator)local_460;
                    cmCatViews((string *)local_498,views_20);
                    cmSystemTools::Error((string *)local_498);
                    goto LAB_00699c86;
                  }
                  if (((local_3f8 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_418._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&local_3c0), !bVar1)) {
                    local_460._0_8_ = local_418._M_string_length;
                    local_460._8_8_ = local_418._M_dataplus._M_p;
                    local_460._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_498._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_498._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    local_498._16_8_ = local_498 + 0x18;
                    local_498[0x18] = '/';
                    local_460._24_8_ = 1;
                    local_438 = 0;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._8_8_;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3c0._M_allocated_capacity;
                    local_420 = (String *)0x0;
                    views_08._M_len = 3;
                    views_08._M_array = (iterator)local_460;
                    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_498._16_8_;
                    cmCatViews(&local_2d0,views_08);
                    std::__cxx11::string::operator=
                              ((string *)local_3c0._M_local_buf,(string *)&local_2d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else if (local_380._0_1_ == true) {
                  local_460._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(arg_pp->_M_dataplus)._M_p;
                  local_460._24_8_ = arg_pp->_M_string_length;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x18;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x96a3f8;
                  local_420 = (String *)0x0;
                  views_19._M_len = 3;
                  views_19._M_array = (iterator)local_460;
                  cmCatViews((string *)local_498,views_19);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_00699c86;
                }
                bVar1 = Json::Value::isMember(pVVar6,"lookup-method");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"lookup-method");
                  bVar1 = Json::Value::isString(pVVar6);
                  if (!bVar1) {
                    local_460._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x26;
                    local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                    local_460._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(arg_pp->_M_dataplus)._M_p;
                    local_460._24_8_ = arg_pp->_M_string_length;
                    local_438 = 0;
                    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x1f;
                    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x96a459;
                    local_420 = (String *)0x0;
                    views_21._M_len = 3;
                    views_21._M_array = (iterator)local_460;
                    cmCatViews((string *)local_498,views_21);
                    cmSystemTools::Error((string *)local_498);
                    goto LAB_00699c86;
                  }
                  Json::Value::asString_abi_cxx11_((String *)local_460,pVVar6);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_460._8_8_ ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0xd) {
                    if (*(long *)(local_460._0_8_ + 5) == 0x656c676e612d6564 &&
                        *(size_type *)local_460._0_8_ == 0x2d6564756c636e69) {
                      LVar5 = IncludeAngle;
                    }
                    else {
                      LVar5 = IncludeQuote;
                      if (*(long *)(local_460._0_8_ + 5) != 0x65746f75712d6564 ||
                          *(size_type *)local_460._0_8_ != 0x2d6564756c636e69) goto LAB_00699a4b;
                    }
                  }
                  else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_460._8_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7) ||
                          (LVar5 = ByName,
                          *(int *)(local_460._0_8_ + 3) != 0x656d616e ||
                          *(int *)local_460._0_8_ != 0x6e2d7962)) {
LAB_00699a4b:
                    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[33],std::__cxx11::string&>
                              ((string *)local_498,
                               (char (*) [39])"-E cmake_ninja_dyndep failed to parse ",arg_pp,
                               (char (*) [33])": lookup-method is not a valid: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_460);
                    cmSystemTools::Error((string *)local_498);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_498._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_498 + 0x10)) {
                      operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
                    }
                    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_460._16_8_;
                    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_460._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_460._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_460 + 0x10)) goto LAB_00699c99;
                    goto LAB_00699ca1;
                  }
                  local_37c = LVar5;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_460._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_460 + 0x10)) {
                    operator_delete((void *)local_460._0_8_,(ulong)(local_460._16_8_ + 1));
                  }
                }
                else if (local_380._0_1_ == true) {
                  local_37c = ByName;
                }
                std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                          (local_288,(value_type *)local_3e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3a0._M_allocated_capacity != &local_390) {
                  operator_delete((void *)local_3a0._M_allocated_capacity,
                                  (ulong)(local_390._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3c0._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b0) {
                  operator_delete((void *)local_3c0._M_allocated_capacity,
                                  (ulong)(local_3b0._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3e0 + 0x10)) {
                  operator_delete((void *)local_3e0._0_8_,(ulong)(local_3e0._16_8_ + 1));
                }
                Json::ValueIteratorBase::increment(&local_3f0);
                goto LAB_006991ca;
              }
              pVVar7 = Json::Value::operator[](pVVar6,"compiled-module-path");
              bVar1 = ParseFilename(pVVar7,(string *)&local_3a0);
              if (bVar1) {
                if (((local_3f8 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_418._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) &&
                   (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&local_3a0), !bVar1)) {
                  local_460._0_8_ = local_418._M_string_length;
                  local_460._8_8_ = local_418._M_dataplus._M_p;
                  local_460._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_498._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._16_8_ = local_498 + 0x18;
                  local_498[0x18] = '/';
                  local_460._24_8_ = 1;
                  local_438 = 0;
                  local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3a0._8_8_;
                  local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3a0._M_allocated_capacity;
                  local_420 = (String *)0x0;
                  views_07._M_len = 3;
                  views_07._M_array = (iterator)local_460;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_498._16_8_;
                  cmCatViews(&local_2d0,views_07);
                  std::__cxx11::string::operator=
                            ((string *)local_3a0._M_local_buf,(string *)&local_2d0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                }
                goto LAB_006993b7;
              }
              local_460._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_460._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(arg_pp->_M_dataplus)._M_p;
              local_460._24_8_ = arg_pp->_M_string_length;
              local_438 = 0;
              local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x12;
              local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x96a358;
              local_420 = (String *)0x0;
              views_17._M_len = 3;
              views_17._M_array = (iterator)local_460;
              cmCatViews((string *)local_498,views_17);
              cmSystemTools::Error((string *)local_498);
LAB_00699c86:
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_498._16_8_;
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_498._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_498 + 0x10)) {
LAB_00699c99:
                operator_delete(paVar11,(ulong)((long)paVar10 + 1));
              }
LAB_00699ca1:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_allocated_capacity != &local_390) {
                operator_delete((void *)local_3a0._M_allocated_capacity,
                                (ulong)(local_390._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0) {
                operator_delete((void *)local_3c0._M_allocated_capacity,(ulong)(local_3b0._0_8_ + 1)
                               );
              }
            }
            else {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[27]>
                        ((string *)local_3e0,(char (*) [39])"-E cmake_ninja_dyndep failed to parse "
                         ,arg_pp,(char (*) [27])": requires is not an array");
              cmSystemTools::Error((string *)local_3e0);
            }
            goto LAB_00699ceb;
          }
LAB_006996d1:
          if ((local_3f8 == '\x01') &&
             (local_3f8 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_418._M_dataplus._M_p != &local_418.field_2)) {
            operator_delete(local_418._M_dataplus._M_p,
                            (ulong)(local_418.field_2._M_allocated_capacity + 1));
          }
          Json::ValueIteratorBase::increment(&local_298);
        }
        goto LAB_00698697;
      }
      local_3e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x26;
      local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
      local_3e0._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3c0._M_allocated_capacity = (size_type)(arg_pp->_M_dataplus)._M_p;
      local_3e0._24_8_ = arg_pp->_M_string_length;
      local_3c0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3b0._0_8_ = &DAT_00000019;
      local_3b0._8_8_ = ": expected 1 source entry";
      local_3a0._M_allocated_capacity = 0;
      views_09._M_len = 3;
      views_09._M_array = (iterator)local_3e0;
      cmCatViews((string *)local_460,views_09);
      cmSystemTools::Error((string *)local_460);
      local_418.field_2._M_allocated_capacity = local_460._16_8_;
      local_418._M_dataplus._M_p = (pointer)local_460._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_460 + 0x10)) goto LAB_00698577;
    }
    else {
      Json::Value::asString_abi_cxx11_((String *)local_498,pVVar6);
      local_3e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x26;
      local_3e0._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
      local_3e0._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3c0._M_allocated_capacity = (size_type)(arg_pp->_M_dataplus)._M_p;
      local_3e0._24_8_ = arg_pp->_M_string_length;
      local_3c0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_3b0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xa;
      local_3b0._8_8_ = ": version ";
      local_3a0._M_allocated_capacity = 0;
      local_3a0._8_8_ = local_498._8_8_;
      local_390._M_allocated_capacity = local_498._0_8_;
      views._M_len = 4;
      views._M_array = (iterator)local_3e0;
      local_390._8_8_ = local_498;
      cmCatViews((string *)local_460,views);
      cmSystemTools::Error((string *)local_460);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_460 + 0x10)) {
        operator_delete((void *)local_460._0_8_,(ulong)(local_460._16_8_ + 1));
      }
      local_418.field_2._M_allocated_capacity = local_498._16_8_;
      local_418._M_dataplus._M_p = (pointer)local_498._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_498 + 0x10)) {
LAB_00698577:
        operator_delete(local_418._M_dataplus._M_p,
                        (ulong)(local_418.field_2._M_allocated_capacity + 1));
      }
    }
  }
  else {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_418,(Reader *)local_3e0);
    local_460._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x26;
    local_460._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
    local_460._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(arg_pp->_M_dataplus)._M_p;
    local_460._24_8_ = arg_pp->_M_string_length;
    local_438 = 0;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_string_length;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_460;
    local_420 = &local_418;
    cmCatViews((string *)local_498,views_00);
    cmSystemTools::Error((string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_498._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      (ulong)(local_418.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_p != local_330) {
      operator_delete(local_340._M_p,local_330[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               &local_390);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3e0);
  }
LAB_00698695:
  bVar9 = false;
LAB_00698697:
  std::ifstream::~ifstream(&local_238);
  Json::Value::~Value(&local_270);
  return bVar9;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }
    }
  }

  return true;
}